

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::Option::check_fname(Option *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ptrdiff_t pVar2;
  bool bVar3;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  if ((this->fnames_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->fnames_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = false;
  }
  else {
    local_48._M_dataplus._M_p = (name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar1) {
      local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_48.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    }
    else {
      local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_48._M_string_length = name->_M_string_length;
    (name->_M_dataplus)._M_p = (pointer)paVar1;
    name->_M_string_length = 0;
    (name->field_2)._M_local_buf[0] = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_28,&this->fnames_);
    pVar2 = detail::find_member(&local_48,&local_28,
                                (this->super_OptionBase<CLI::Option>).ignore_case_,
                                (this->super_OptionBase<CLI::Option>).ignore_underscore_);
    bVar3 = -1 < pVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return bVar3;
}

Assistant:

bool from_stream(const std::string &istring, T &obj) {
    std::istringstream is;
    is.str(istring);
    is >> obj;
    return !is.fail() && !is.rdbuf()->in_avail();
}